

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O2

void __thiscall CSocekt::Shutdown_subproc(CSocekt *this)

{
  int iVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  SourceFile file;
  undefined1 local_1008 [12];
  Logger local_ff8;
  
  iVar1 = sem_post((sem_t *)&this->m_semEventSendQueue);
  if ((iVar1 == -1) && (muduo::g_logLevel < 3)) {
    muduo::Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_1008,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_1008._0_8_;
    file.size_ = local_1008._8_4_;
    muduo::Logger::Logger(&local_ff8,file,0x97);
    muduo::LogStream::operator<<(&local_ff8.impl_.stream_,anon_var_dwarf_1874d);
    muduo::Logger::~Logger(&local_ff8);
  }
  for (ppTVar3 = (this->m_threadVector).
                 super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar3 !=
      (this->m_threadVector).
      super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
    pthread_join((*ppTVar3)->_Handle,(void **)0x0);
  }
  for (ppTVar2 = (this->m_threadVector).
                 super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar2 != ppTVar3; ppTVar2 = ppTVar2 + 1
      ) {
    if (*ppTVar2 != (ThreadItem *)0x0) {
      operator_delete(*ppTVar2);
      ppTVar3 = (this->m_threadVector).
                super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  ppTVar2 = (this->m_threadVector).
            super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppTVar3 != ppTVar2) {
    (this->m_threadVector).
    super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar2;
  }
  clearMsgSendQueue(this);
  clearconnection(this);
  clearAllFromTimerQueue(this);
  sem_destroy((sem_t *)&this->m_semEventSendQueue);
  return;
}

Assistant:

void CSocekt::Shutdown_subproc()
{
    //(1)把干活的线程停止掉，注意 系统应该尝试通过设置 g_stopEvent = 1来 开始让整个项目停止
    //(2)用到信号量的，可能还需要调用一下sem_post
    if(sem_post(&m_semEventSendQueue)==-1)  //让ServerSendQueueThread()流程走下来干活
    {
        LOG_INFO << "CSocekt::Shutdown_subproc()中sem_post(&m_semEventSendQueue)失败." ;
    }

    std::vector<ThreadItem*>::iterator iter;
	for(iter = m_threadVector.begin(); iter != m_threadVector.end(); iter++)
    {
        pthread_join((*iter)->_Handle, NULL); //等待一个线程终止
    }
    //(2)释放一下new出来的ThreadItem【线程池中的线程】    
	for(iter = m_threadVector.begin(); iter != m_threadVector.end(); iter++)
	{
		if(*iter)
			delete *iter;
	}
	m_threadVector.clear();

    //(3)队列相关
    clearMsgSendQueue();
    clearconnection();
    clearAllFromTimerQueue();
    
    //(4)多线程相关    
    sem_destroy(&m_semEventSendQueue);                  //发消息相关线程信号量释放
}